

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O0

void __thiscall OpenMD::AtomStamp::AtomStamp(AtomStamp *this,int index)

{
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  value_type *in_stack_ffffffffffffff08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *__a;
  allocator<char> *__s;
  allocator<char> local_91;
  string local_90 [79];
  allocator<char> local_41;
  string local_40 [52];
  undefined4 local_c;
  
  local_c = in_ESI;
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  *(undefined ***)in_RDI = &PTR__AtomStamp_004fe7d8;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  Vector3<double>::Vector3((Vector3<double> *)0x280c88);
  Vector3<double>::Vector3((Vector3<double> *)0x280c9b);
  in_RDI[7].field_2._M_local_buf[0] = '\0';
  in_RDI[7].field_2._M_local_buf[1] = '\0';
  in_RDI[7].field_2._M_local_buf[2] = '\0';
  *(undefined4 *)((long)&in_RDI[7].field_2 + 4) = local_c;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x280cd5);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x280ceb);
  __a = (allocator<char> *)&in_RDI[3]._M_string_length;
  __s = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)&in_RDI->_M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_ffffffffffffff08->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_ffffffffffffff08);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x280dec);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

AtomStamp::AtomStamp(int index) :
      havePos_(false), haveOrt_(false), hasOverride_(false), index_(index) {
    DefineParameter(Type, "type");
  }